

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL> *
split<4u>(string *s,char sep)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  invalid_argument *this;
  reference pvVar5;
  istream *piVar6;
  out_of_range *poVar7;
  char in_DL;
  undefined8 in_RSI;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  *in_RDI;
  string tmp;
  uint32_t i;
  istringstream iss;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  *result;
  size_type in_stack_fffffffffffffdd8;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  *in_stack_fffffffffffffde0;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  *in_stack_fffffffffffffdf0;
  string *this_00;
  string local_1d0 [36];
  uint local_1ac;
  istringstream local_1a8 [406];
  byte local_12;
  char local_11;
  undefined8 local_10;
  
  local_12 = 0;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
  array(in_stack_fffffffffffffdf0);
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     ((pcVar4 = (char *)std::__cxx11::string::front(), *pcVar4 == local_11 ||
      (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == local_11)))) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"strings starts or ends with separator");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::istringstream::istringstream(local_1a8,local_10,8);
  local_1ac = 0;
  while( true ) {
    if (3 < local_1ac) {
      this_00 = local_1d0;
      std::__cxx11::string::string(this_00);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1a8,this_00,local_11);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if (bVar2) {
        poVar7 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(poVar7,"n");
        __cxa_throw(poVar7,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      local_12 = 1;
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::istringstream::~istringstream(local_1a8);
      if ((local_12 & 1) == 0) {
        std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
        ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                  *)this_00);
      }
      return in_RDI;
    }
    pvVar5 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
             ::operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,(string *)pvVar5,local_11);
    bVar1 = std::ios::operator!((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
    if ((bVar1 & 1) != 0) break;
    local_1ac = local_1ac + 1;
  }
  poVar7 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(poVar7,"n");
  __cxa_throw(poVar7,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

std::array<std::string, n> split(const std::string& s, const char sep)
{
  std::array<std::string, n> result;

  if (!s.empty())
  {
    if (s.front() == sep || s.back() == sep)
    {
      throw std::invalid_argument("strings starts or ends with separator");
    }
  }

  std::istringstream iss(s);
  for (uint32_t i = 0; i < n; ++i)
  {
    if (!std::getline(iss, result[i], sep))
    {
      throw std::out_of_range("n");
    }
  }

  std::string tmp;
  if (std::getline(iss, tmp, sep))
  {
    throw std::out_of_range("n");
  }

  return result;
}